

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O3

uint8_t * __thiscall
ot::commissioner::cose::Sign1Message::GetPayload(Sign1Message *this,size_t *aLength)

{
  cn_cbor *pcVar1;
  uint8_t *puVar2;
  
  if ((HCOSE)this->mSign != (HCOSE)0x0) {
    pcVar1 = COSE_get_cbor((HCOSE)this->mSign);
    if ((((pcVar1 == (cn_cbor *)0x0) || (pcVar1->type != CN_CBOR_ARRAY)) ||
        ((uint)pcVar1->length < 2)) ||
       ((pcVar1 = pcVar1->first_child->next->next, pcVar1 == (cn_cbor *)0x0 ||
        (pcVar1->type != CN_CBOR_BYTES)))) {
      puVar2 = (uint8_t *)0x0;
    }
    else {
      puVar2 = (pcVar1->v).bytes;
      *aLength = (long)pcVar1->length;
    }
    return puVar2;
  }
  abort();
}

Assistant:

const uint8_t *Sign1Message::GetPayload(size_t &aLength)
{
    const uint8_t *ret = nullptr;
    cn_cbor       *cbor;
    cn_cbor       *payload;

    VerifyOrDie(mSign != nullptr);
    VerifyOrExit((cbor = COSE_get_cbor(reinterpret_cast<HCOSE>(mSign))) != nullptr);

    VerifyOrExit(cbor->type == CN_CBOR_ARRAY && (payload = CborArrayAt(cbor, 2)) != nullptr);

    VerifyOrExit(payload->type == CN_CBOR_BYTES);

    ret     = payload->v.bytes;
    aLength = payload->length;

exit:
    return ret;
}